

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

void do_cmd_alter_aux(wchar_t dir)

{
  player *p;
  _Bool _Var1;
  loc grid;
  object *obj;
  object *obj_00;
  square *psVar2;
  int in_EDI;
  int local_2c;
  
  local_2c = in_EDI;
  grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[in_EDI]);
  p = player;
  player->upkeep->energy_use = (uint)z_info->move_energy;
  _Var1 = player_confuse_dir(p,&local_2c,false);
  if (_Var1) {
    grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[local_2c]);
  }
  obj = chest_check(player,grid,CHEST_OPENABLE);
  obj_00 = chest_check(player,grid,CHEST_TRAPPED);
  psVar2 = square(cave,grid);
  if (0 < psVar2->mon) {
    py_attack(player,grid);
    goto LAB_0012df8a;
  }
  _Var1 = square_isdiggable(cave,grid);
  if (_Var1) {
    _Var1 = do_cmd_tunnel_aux(grid);
  }
  else {
    _Var1 = square_iscloseddoor(cave,grid);
    if (_Var1) {
      _Var1 = do_cmd_open_aux(grid);
    }
    else {
      _Var1 = square_isbasicmonstertrap(cave,grid);
      if (_Var1) {
        modify_monster_trap(grid);
        goto LAB_0012df8a;
      }
      _Var1 = square_isdisarmabletrap(cave,grid);
      if ((_Var1) || (_Var1 = square_isadvancedmonstertrap(cave,grid), _Var1)) {
        _Var1 = do_cmd_disarm_aux(grid);
      }
      else {
        _Var1 = flag_has_dbg((player->state).pflags,10,0x2f,"player->state.pflags","(PF_TRAP)");
        if ((_Var1) && (_Var1 = square_istrappable(cave,grid), _Var1)) {
          do_cmd_set_trap(grid);
          goto LAB_0012df8a;
        }
        if (obj_00 == (object *)0x0) {
          if (obj == (object *)0x0) {
            _Var1 = square_isopendoor(cave,grid);
            if (_Var1) {
              do_cmd_close_aux(grid);
            }
            else {
              msg("You spin around.");
            }
            goto LAB_0012df8a;
          }
          _Var1 = do_cmd_open_chest(grid,obj);
        }
        else {
          _Var1 = do_cmd_disarm_chest(obj_00);
        }
      }
    }
  }
  if (_Var1 != false) {
    return;
  }
LAB_0012df8a:
  disturb(player);
  return;
}

Assistant:

static void do_cmd_alter_aux(int dir)
{
	struct loc grid;
	bool more = false;
	struct object *o_chest_closed;
	struct object *o_chest_trapped;

	/* Get location */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Apply confusion */
	if (player_confuse_dir(player, &dir, false)) {
		/* Get location */
		grid = loc_sum(player->grid, ddgrid[dir]);
	}

	/* Check for closed chest */
	o_chest_closed = chest_check(player, grid, CHEST_OPENABLE);
	/* Check for trapped chest */
	o_chest_trapped = chest_check(player, grid, CHEST_TRAPPED);

	/* Action depends on what's there */
	if (square(cave, grid)->mon > 0) {
		/* Attack monster */
		py_attack(player, grid);
	} else if (square_isdiggable(cave, grid)) {
		/* Tunnel through walls and rubble */
		more = do_cmd_tunnel_aux(grid);
	} else if (square_iscloseddoor(cave, grid)) {
		/* Open closed doors */
		more = do_cmd_open_aux(grid);
	} else if (square_isbasicmonstertrap(cave, grid)) {
		/* Modify monster traps */
		modify_monster_trap(grid);
	} else if (square_isdisarmabletrap(cave, grid) ||
			   square_isadvancedmonstertrap(cave, grid)) {
		/* Disarm traps */
		more = do_cmd_disarm_aux(grid);
	} else if (player_has(player, PF_TRAP) && square_istrappable(cave, grid)) {
		/* Set traps */
		do_cmd_set_trap(grid);
	} else if (o_chest_trapped) {
		/* Trapped chest */
		more = do_cmd_disarm_chest(o_chest_trapped);
	} else if (o_chest_closed) {
		/* Open chest */
		more = do_cmd_open_chest(grid, o_chest_closed);
	} else if (square_isopendoor(cave, grid)) {
		/* Close door */
        	more = do_cmd_close_aux(grid);
	} else {
		/* Oops */
		msg("You spin around.");
	}

	/* Cancel repetition unless we can continue */
	if (!more) disturb(player);
}